

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::InitializeNode
          (PeerManagerImpl *this,CNode *node,ServiceFlags our_services)

{
  _Base_ptr *this_00;
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  ConnectionType CVar3;
  NetPermissionFlags NVar4;
  _Base_ptr peer;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  size_t sVar7;
  _Base_ptr this_01;
  time_point tVar8;
  _Base_ptr p_Var9;
  _Link_type __p;
  pointer *__ptr;
  _Link_type __k;
  long in_FS_OFFSET;
  bool bVar10;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar11;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peer = (_Base_ptr)node->id;
  local_48._M_device = (mutex_type *)&cs_main;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_48);
  CVar3 = node->m_conn_type;
  p_Var6 = (_Rb_tree_node_base *)operator_new(0xc0);
  this_00 = &p_Var6[3]._M_left;
  *(_Base_ptr *)(p_Var6 + 1) = peer;
  p_Var6[3]._M_parent = (_Base_ptr)0x0;
  p_Var6[1]._M_parent = (_Base_ptr)0x0;
  p_Var6[1]._M_left = (_Base_ptr)0x0;
  p_Var6[1]._M_right = (_Base_ptr)0x0;
  *(undefined8 *)(p_Var6 + 2) = 0;
  p_Var6[2]._M_parent = (_Base_ptr)0x0;
  p_Var6[2]._M_left = (_Base_ptr)0x0;
  *(undefined8 *)((long)&p_Var6[2]._M_left + 1) = 0;
  *(undefined8 *)((long)&p_Var6[2]._M_right + 1) = 0;
  p_Var6[3]._M_right = (_Base_ptr)this_00;
  p_Var6[3]._M_left = (_Base_ptr)this_00;
  p_Var6[4]._M_right = (_Base_ptr)0x0;
  *(undefined8 *)(p_Var6 + 5) = 0;
  *(undefined2 *)&p_Var6[5]._M_parent = 0;
  p_Var6[5]._M_left = (_Base_ptr)0x0;
  *(undefined8 *)(p_Var6 + 4) = 0;
  p_Var6[4]._M_parent = (_Base_ptr)0x0;
  *(undefined4 *)((long)&p_Var6[4]._M_parent + 7) = 0;
  *(bool *)&p_Var6[5]._M_right = CVar3 == INBOUND;
  if (((this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (p_Var9 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
     (long)peer <= *(long *)(p_Var9 + 1))) {
    pVar11 = std::
             _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
             ::_M_get_insert_unique_pos
                       (&(this->m_node_states)._M_t,(key_type_conflict4 *)(p_Var6 + 1));
    p_Var9 = pVar11.second;
    bVar10 = pVar11.first != (_Rb_tree_node_base *)0x0;
  }
  else {
    bVar10 = false;
  }
  if (p_Var9 == (_Base_ptr)0x0) {
    std::__cxx11::
    _List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
    ::~_List_base((_List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                   *)this_00);
    operator_delete(p_Var6,0xc0);
  }
  else {
    p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    bVar5 = true;
    if (!bVar10 && p_Var1 != (_Rb_tree_header *)p_Var9) {
      bVar5 = (long)peer < *(long *)(p_Var9 + 1);
    }
    std::_Rb_tree_insert_and_rebalance
              (bVar5,p_Var6,(_Rb_tree_node_base *)p_Var9,(_Rb_tree_node_base *)p_Var1);
    psVar2 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_48);
  local_48._M_device = &(this->m_tx_download_mutex).super_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  sVar7 = TxRequestTracker::Count(&this->m_txrequest,(NodeId)peer);
  if (sVar7 == 0) {
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    NVar4 = node->m_permission_flags;
    this_01 = (_Base_ptr)operator_new(0x290);
    this_01->_M_parent = (_Base_ptr)0x100000001;
    *(undefined ***)this_01 = &PTR___Sp_counted_ptr_inplace_013dc368;
    this_01->_M_left = peer;
    this_01->_M_right = (_Base_ptr)(NVar4 * 2 & 4 | our_services);
    *(undefined8 *)(this_01 + 1) = 0;
    this_01[1]._M_parent = (_Base_ptr)0x0;
    this_01[1]._M_left = (_Base_ptr)0x0;
    this_01[1]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 2) = 0;
    this_01[2]._M_parent = (_Base_ptr)0x0;
    *(undefined1 *)&this_01[2]._M_left = 0;
    this_01[2]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 3) = 0;
    this_01[3]._M_parent = (_Base_ptr)0x0;
    this_01[3]._M_left = (_Base_ptr)0x0;
    this_01[3]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 4) = 0;
    this_01[4]._M_parent = (_Base_ptr)0x0;
    this_01[4]._M_left = (_Base_ptr)0x0;
    this_01[4]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 5) = 0;
    this_01[5]._M_parent = (_Base_ptr)0x0;
    this_01[5]._M_left = (_Base_ptr)0x0;
    this_01[5]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 6) = 0;
    *(undefined8 *)((long)&this_01[6]._M_color + 1) = 0;
    *(undefined8 *)((long)&this_01[6]._M_parent + 1) = 0;
    *(undefined4 *)((long)&this_01[6]._M_left + 4) = 0xffffffff;
    *(undefined2 *)&this_01[7]._M_parent = 0;
    this_01[6]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 7) = 0;
    *(undefined2 *)&this_01[9]._M_color = 0;
    this_01[8]._M_left = (_Base_ptr)0x0;
    this_01[8]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 8) = 0;
    this_01[8]._M_parent = (_Base_ptr)0x0;
    this_01[7]._M_left = (_Base_ptr)0x0;
    this_01[7]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)((long)&this_01[10]._M_left + 2) = 0;
    *(undefined8 *)((long)&this_01[10]._M_right + 2) = 0;
    this_01[10]._M_parent = (_Base_ptr)0x0;
    this_01[10]._M_left = (_Base_ptr)0x0;
    this_01[9]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 10) = 0;
    this_01[9]._M_parent = (_Base_ptr)0x0;
    this_01[9]._M_left = (_Base_ptr)0x0;
    this_01[0xb]._M_parent = (_Base_ptr)0x3ff0000000000000;
    tVar8 = NodeClock::now();
    this_01[0xb]._M_left = (_Base_ptr)((long)tVar8.__d.__r / 1000);
    this_01[0xb]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 0xc) = 0;
    *(undefined1 *)&this_01[0xc]._M_parent = 0;
    this_01[0xc]._M_left = (_Base_ptr)0x0;
    this_01[0xc]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 0xd) = 0;
    this_01[0xd]._M_parent = (_Base_ptr)0x0;
    this_01[0xd]._M_left = (_Base_ptr)0x0;
    this_01[0xd]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 0xe) = 0;
    this_01[0xe]._M_parent = (_Base_ptr)0x0;
    this_01[0xe]._M_left = (_Base_ptr)0x0;
    this_01[0xe]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 0xf) = 0;
    this_01[0xf]._M_parent = (_Base_ptr)0x0;
    this_01[0xf]._M_left = (_Base_ptr)0x0;
    this_01[0xf]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 0x10) = 0;
    __p = (_Link_type)0x0;
    std::_Deque_base<CInv,_std::allocator<CInv>_>::_M_initialize_map
              ((_Deque_base<CInv,_std::allocator<CInv>_> *)&this_01[0xd]._M_right,0);
    this_01[0x12]._M_parent = (_Base_ptr)0x0;
    *(undefined1 *)&this_01[0x12]._M_left = 0;
    this_01[0x10]._M_parent = (_Base_ptr)0x0;
    this_01[0x10]._M_left = (_Base_ptr)0x0;
    this_01[0x10]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 0x11) = 0;
    this_01[0x11]._M_parent = (_Base_ptr)0x0;
    this_01[0x11]._M_left = (_Base_ptr)0x0;
    *(undefined8 *)((long)&this_01[0x11]._M_left + 1) = 0;
    *(undefined8 *)((long)&this_01[0x11]._M_right + 1) = 0;
    this_01[0x12]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 0x13) = 0;
    this_01[0x13]._M_parent = (_Base_ptr)0x0;
    this_01[0x13]._M_left = (_Base_ptr)0x0;
    this_01[0x13]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(this_01 + 0x14) = 0;
    this_01[0x14]._M_parent = (_Base_ptr)0x0;
    local_48._M_device = &(this->m_peer_mutex).super_mutex;
    local_48._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_48);
    p_Var6 = (_Rb_tree_node_base *)operator_new(0x38);
    *(_Base_ptr *)(p_Var6 + 1) = peer;
    p_Var6[1]._M_parent = (_Base_ptr)&this_01->_M_left;
    p_Var6[1]._M_left = this_01;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
    }
    __k = (_Link_type)(p_Var6 + 1);
    if (((this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (p_Var9 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
       *(long *)&__k->super__Rb_tree_node_base <= *(long *)(p_Var9 + 1))) {
      __p = __k;
      pVar11 = std::
               _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
               ::_M_get_insert_unique_pos(&(this->m_peer_map)._M_t,(key_type_conflict4 *)__k);
      p_Var9 = pVar11.second;
      bVar10 = pVar11.first != (_Rb_tree_node_base *)0x0;
    }
    else {
      bVar10 = false;
    }
    if (p_Var9 == (_Base_ptr)0x0) {
      std::
      _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
      ::_M_drop_node((_Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
                      *)p_Var6,__p);
    }
    else {
      p_Var1 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
      bVar5 = true;
      if (!bVar10 && p_Var1 != (_Rb_tree_header *)p_Var9) {
        bVar5 = *(long *)&__k->super__Rb_tree_node_base < *(long *)(p_Var9 + 1);
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar5,p_Var6,(_Rb_tree_node_base *)p_Var9,(_Rb_tree_node_base *)p_Var1);
      psVar2 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar2 = *psVar2 + 1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("m_txrequest.Count(nodeid) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                ,0x6bf,
                "virtual void (anonymous namespace)::PeerManagerImpl::InitializeNode(const CNode &, ServiceFlags)"
               );
}

Assistant:

void PeerManagerImpl::InitializeNode(const CNode& node, ServiceFlags our_services)
{
    NodeId nodeid = node.GetId();
    {
        LOCK(cs_main); // For m_node_states
        m_node_states.emplace_hint(m_node_states.end(), std::piecewise_construct, std::forward_as_tuple(nodeid), std::forward_as_tuple(node.IsInboundConn()));
    }
    {
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Count(nodeid) == 0);
    }

    if (NetPermissions::HasFlag(node.m_permission_flags, NetPermissionFlags::BloomFilter)) {
        our_services = static_cast<ServiceFlags>(our_services | NODE_BLOOM);
    }

    PeerRef peer = std::make_shared<Peer>(nodeid, our_services);
    {
        LOCK(m_peer_mutex);
        m_peer_map.emplace_hint(m_peer_map.end(), nodeid, peer);
    }
}